

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

string * __thiscall
cmGlobalGhsMultiGenerator::TrimQuotes
          (string *__return_storage_ptr__,cmGlobalGhsMultiGenerator *this,string *str)

{
  char *local_40;
  char *ch;
  string *str_local;
  cmGlobalGhsMultiGenerator *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::size();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (local_40 = (char *)std::__cxx11::string::c_str(); *local_40 != '\0'; local_40 = local_40 + 1)
  {
    if (*local_40 != '\"') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*local_40);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGhsMultiGenerator::TrimQuotes(std::string const& str)
{
  std::string result;
  result.reserve(str.size());
  for (const char* ch = str.c_str(); *ch != '\0'; ++ch) {
    if (*ch != '"') {
      result += *ch;
    }
  }
  return result;
}